

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

int Cloud_SharingSize(CloudManager *dd,CloudNode **pn,int nn)

{
  int iVar1;
  int iVar2;
  CloudNode *pCVar3;
  ulong uVar4;
  
  pCVar3 = (CloudNode *)pn;
  if (nn < 1) {
    iVar2 = 0;
  }
  else {
    uVar4 = 0;
    iVar2 = 0;
    do {
      iVar1 = cloudDagSize((CloudManager *)((ulong)pn[uVar4] & 0xfffffffffffffffe),pCVar3);
      iVar2 = iVar2 + iVar1;
      uVar4 = uVar4 + 1;
    } while ((uint)nn != uVar4);
  }
  if (0 < nn) {
    uVar4 = 0;
    do {
      cloudClearMark((CloudManager *)((ulong)pn[uVar4] & 0xfffffffffffffffe),pCVar3);
      uVar4 = uVar4 + 1;
    } while ((uint)nn != uVar4);
  }
  return iVar2;
}

Assistant:

int Cloud_SharingSize( CloudManager * dd, CloudNode ** pn, int nn )
{
    int res, i;
    res = 0;
    for ( i = 0; i < nn; i++ )
        res += cloudDagSize( dd, Cloud_Regular( pn[i] ) );
    for ( i = 0; i < nn; i++ )
        cloudClearMark( dd, Cloud_Regular( pn[i] ) );
    return res;
}